

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O2

void foo1(int *a)

{
  ostream *poVar1;
  saver_success<int_&> SAVER_SUCCES_0;
  state_saver<int_&,_nstd::detail::on_success_policy> local_20;
  
  local_20.policy_.ec_ = std::uncaught_exceptions();
  local_20.previous_value_ = *a;
  *a = 1;
  local_20.previous_ref_ = a;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo1 a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*a);
  std::endl<char,std::char_traits<char>>(poVar1);
  nstd::detail::state_saver<int_&,_nstd::detail::on_success_policy>::~state_saver(&local_20);
  return;
}

Assistant:

void foo1(int& a) {
  SAVER_SUCCESS(a); // State saver on success.

  a = 1;
  std::cout << "foo1 a = " << a << std::endl;
 // Original state will automatically restored, on scope leave when no exceptions have been thrown.
}